

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int CollectionLoadHeader(unqlite_col *pCol)

{
  sxu32 local_38;
  int rc;
  sxu32 iDos;
  sxu16 nMagic;
  uchar *zEnd;
  uchar *zRaw;
  SyBlob *pHeader;
  unqlite_col *pCol_local;
  
  zRaw = (uchar *)&pCol->sHeader;
  pHeader = (SyBlob *)pCol;
  SyBlobReset((SyBlob *)zRaw);
  pCol_local._4_4_ =
       unqlite_kv_cursor_data_callback
                 (*(unqlite_kv_cursor **)&pHeader[8].nFlags,unqliteDataConsumer,zRaw);
  if (pCol_local._4_4_ == 0) {
    if (*(uint *)(zRaw + 0x10) < 0x16) {
      pCol_local._4_4_ = -0x18;
    }
    else {
      zEnd = *(uchar **)(zRaw + 8);
      _iDos = zEnd + *(uint *)(zRaw + 0x10);
      SyBigEndianUnpack16(zEnd,(sxu16 *)((long)&rc + 2));
      if (rc._2_2_ == 0x611e) {
        zEnd = zEnd + 2;
        SyBigEndianUnpack64(zEnd,(sxu64 *)&pHeader[5].pBlob);
        zEnd = zEnd + 8;
        SyBigEndianUnpack64(zEnd,(sxu64 *)&pHeader[5].nFlags);
        zEnd = zEnd + 8;
        SyBigEndianUnpack32(zEnd,&local_38);
        SyDosTimeFormat(local_38,(Sytm *)(pHeader + 7));
        zEnd = zEnd + 4;
        *(int *)&pHeader[3].pAllocator = (int)zEnd - (int)*(undefined8 *)(zRaw + 8);
        if (zEnd < _iDos) {
          FastJsonDecode(zEnd,(int)_iDos - (int)zEnd,(jx9_value *)(pHeader + 1),(uchar **)0x0,0);
        }
        pCol_local._4_4_ = 0;
      }
      else {
        pCol_local._4_4_ = -0x18;
      }
    }
  }
  return pCol_local._4_4_;
}

Assistant:

static int CollectionLoadHeader(unqlite_col *pCol)
{
	SyBlob *pHeader = &pCol->sHeader;
	unsigned char *zRaw,*zEnd;
	sxu16 nMagic;
	sxu32 iDos;
	int rc;
	SyBlobReset(pHeader);
	/* Read the binary header */
	rc = unqlite_kv_cursor_data_callback(pCol->pCursor,unqliteDataConsumer,pHeader);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Perform a sanity check */
	if( SyBlobLength(pHeader) < (2 /* magic */ + 8 /* record_id */ + 8 /* total_records */+ 4 /* DOS creation time*/) ){
		return UNQLITE_CORRUPT;
	}
	zRaw = (unsigned char *)SyBlobData(pHeader);
	zEnd = &zRaw[SyBlobLength(pHeader)];
	/* Extract the magic number */
	SyBigEndianUnpack16(zRaw,&nMagic);
	if( nMagic != UNQLITE_COLLECTION_MAGIC ){
		return UNQLITE_CORRUPT;
	}
	zRaw += 2; /* sizeof(sxu16) */
	/* Extract the record ID */
	SyBigEndianUnpack64(zRaw,(sxu64 *)&pCol->nLastid);
	zRaw += 8; /* sizeof(sxu64) */
	/* Total records in the collection */
	SyBigEndianUnpack64(zRaw,(sxu64 *)&pCol->nTotRec);
	/* Extract the collection creation date (DOS) */
	zRaw += 8; /* sizeof(sxu64) */
	SyBigEndianUnpack32(zRaw,&iDos);
	SyDosTimeFormat(iDos,&pCol->sCreation);
	zRaw += 4;
	/* Check for a collection schema */
	pCol->nSchemaOfft = (sxu32)(zRaw - (unsigned char *)SyBlobData(pHeader));
	if( zRaw < zEnd ){
		/* Decode the FastJson value */
		FastJsonDecode((const void *)zRaw,(sxu32)(zEnd-zRaw),&pCol->sSchema,0,0);
	}
	return UNQLITE_OK;
}